

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIButton::setImage
          (CGUIButton *this,EGUI_BUTTON_IMAGE_STATE state,ITexture *image,rect<int> *sourceRect)

{
  long lVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  u32 stateIdx;
  IReferenceCounted *in_stack_ffffffffffffffc8;
  
  if ((int)in_ESI < 9) {
    if (in_RDX != (long *)0x0) {
      IReferenceCounted::grab((IReferenceCounted *)((long)in_RDX + *(long *)(*in_RDX + -0x18)));
    }
    if (*(long *)(in_RDI + 400 + (ulong)in_ESI * 0x18) != 0) {
      IReferenceCounted::drop(in_stack_ffffffffffffffc8);
    }
    *(long **)(in_RDI + 400 + (ulong)in_ESI * 0x18) = in_RDX;
    lVar1 = in_RDI + 400 + (ulong)in_ESI * 0x18;
    *(undefined8 *)(lVar1 + 8) = *in_RCX;
    *(undefined8 *)(lVar1 + 0x10) = in_RCX[1];
  }
  return;
}

Assistant:

void CGUIButton::setImage(EGUI_BUTTON_IMAGE_STATE state, video::ITexture *image, const core::rect<s32> &sourceRect)
{
	if (state >= EGBIS_COUNT)
		return;

	if (image)
		image->grab();

	u32 stateIdx = (u32)state;
	if (ButtonImages[stateIdx].Texture)
		ButtonImages[stateIdx].Texture->drop();

	ButtonImages[stateIdx].Texture = image;
	ButtonImages[stateIdx].SourceRect = sourceRect;
}